

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O2

void __thiscall
fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<char16_t>_>::on_sign
          (specs_checker<fmt::v8::detail::specs_handler<char16_t>_> *this,sign_t s)

{
  type tVar1;
  basic_format_specs<char16_t> *pbVar2;
  
  require_numeric_argument(this);
  tVar1 = this->arg_type_;
  if ((tVar1 - int_type < 8) && ((char_type < tVar1 || ((0x10aU >> (tVar1 & 0x1f) & 1) == 0)))) {
    fmt::v8::detail::throw_format_error("format specifier requires signed argument");
  }
  pbVar2 = (this->super_specs_handler<char16_t>).super_specs_setter<char16_t>.specs_;
  *(ushort *)&pbVar2->field_0x9 = *(ushort *)&pbVar2->field_0x9 & 0xff8f | (ushort)((s & 7) << 4);
  return;
}

Assistant:

FMT_CONSTEXPR void on_sign(sign_t s) {
    require_numeric_argument();
    if (is_integral_type(arg_type_) && arg_type_ != type::int_type &&
        arg_type_ != type::long_long_type && arg_type_ != type::char_type) {
      this->on_error("format specifier requires signed argument");
    }
    Handler::on_sign(s);
  }